

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 rhs;
  uint uVar1;
  ImVec2 IVar2;
  long lVar3;
  short sVar4;
  long lVar5;
  ImVec2 *pIVar6;
  ImDrawIdx IVar7;
  float fVar8;
  undefined8 uStack_e0;
  ImVec2 IStack_d8;
  ImVec2 *local_d0;
  ImDrawList *local_c8;
  int local_c0;
  int local_bc;
  int i_2;
  int i_1;
  int vtx_count_1;
  int idx_count_1;
  ImVec2 local_a8;
  float local_a0;
  float local_9c;
  float scale;
  float dmr2;
  ImVec2 local_90;
  ImVec2 dm;
  ImVec2 *n1;
  ImVec2 *n0;
  int i1_1;
  int i0_1;
  ImVec2 diff;
  ImVec2 *p1;
  ImVec2 *p0;
  int i1;
  int i0;
  ImVec2 *temp_normals;
  int i;
  uint vtx_outer_idx;
  uint vtx_inner_idx;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  ImVec2 uv;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  IVar2 = this->_Data->TexUvWhitePixel;
  local_c8 = this;
  if ((this->Flags & 2U) == 0) {
    i_1 = (points_count + -2) * 3;
    uStack_e0 = 0x1fa4ce;
    i_2 = points_count;
    PrimReserve(this,i_1,points_count);
    for (local_bc = 0; local_bc < i_2; local_bc = local_bc + 1) {
      local_c8->_VtxWritePtr->pos = points[local_bc];
      local_c8->_VtxWritePtr->uv = IVar2;
      local_c8->_VtxWritePtr->col = col;
      local_c8->_VtxWritePtr = local_c8->_VtxWritePtr + 1;
    }
    for (local_c0 = 2; local_c0 < points_count; local_c0 = local_c0 + 1) {
      *local_c8->_IdxWritePtr = (ImDrawIdx)local_c8->_VtxCurrentIdx;
      local_c8->_IdxWritePtr[1] = ((short)local_c8->_VtxCurrentIdx + (short)local_c0) - 1;
      local_c8->_IdxWritePtr[2] = (short)local_c8->_VtxCurrentIdx + (short)local_c0;
      local_c8->_IdxWritePtr = local_c8->_IdxWritePtr + 3;
    }
    local_c8->_VtxCurrentIdx = (i_2 & 0xffffU) + local_c8->_VtxCurrentIdx;
  }
  else {
    uStack_e0 = 0x1fa0e2;
    PrimReserve(this,points_count * 9 + -6,points_count << 1);
    uVar1 = local_c8->_VtxCurrentIdx;
    sVar4 = (short)local_c8->_VtxCurrentIdx + 1;
    for (temp_normals._4_4_ = 2; IVar7 = (ImDrawIdx)uVar1, temp_normals._4_4_ < points_count;
        temp_normals._4_4_ = temp_normals._4_4_ + 1) {
      *local_c8->_IdxWritePtr = IVar7;
      local_c8->_IdxWritePtr[1] = IVar7 + ((short)temp_normals._4_4_ + -1) * 2;
      local_c8->_IdxWritePtr[2] = IVar7 + (short)(temp_normals._4_4_ << 1);
      local_c8->_IdxWritePtr = local_c8->_IdxWritePtr + 3;
    }
    lVar3 = -((long)points_count * 8 + 0xfU & 0xfffffffffffffff0);
    lVar5 = lVar3 + -0xd8;
    p0._4_4_ = points_count + -1;
    for (p0._0_4_ = 0; (int)p0 < points_count; p0._0_4_ = (int)p0 + 1) {
      diff = (ImVec2)(points + (int)p0);
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa1c5;
      _i1_1 = ::operator-(points + (int)p0,points + p0._4_4_);
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa1db;
      fVar8 = ImInvLength((ImVec2 *)&i1_1,1.0);
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa1e4;
      operator*=((ImVec2 *)&i1_1,fVar8);
      *(int *)((long)&IStack_d8 + (long)p0._4_4_ * 8 + lVar5 + 0xd8) = i0_1;
      *(uint *)((long)&IStack_d8 + (long)p0._4_4_ * 8 + lVar3 + 4) = i1_1 ^ 0x80000000;
      p0._4_4_ = (int)p0;
    }
    n0._4_4_ = points_count + -1;
    for (n0._0_4_ = 0; (int)n0 < points_count; n0._0_4_ = (int)n0 + 1) {
      rhs = (ImVec2)((long)&IStack_d8 + (long)(int)n0 * 8 + lVar5 + 0xd8);
      dm = rhs;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa272;
      _scale = ::operator+((ImVec2 *)((long)&IStack_d8 + (long)n0._4_4_ * 8 + lVar5 + 0xd8),
                           (ImVec2 *)rhs);
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa28e;
      local_90 = ::operator*((ImVec2 *)&scale,0.5);
      local_9c = local_90.x * local_90.x + local_90.y * local_90.y;
      if (1e-06 < local_9c) {
        local_a0 = 1.0 / local_9c;
        if (100.0 < local_a0) {
          local_a0 = 100.0;
        }
        fVar8 = local_a0;
        *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa32c;
        operator*=(&local_90,fVar8);
      }
      local_d0 = &local_90;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa347;
      operator*=(&local_90,0.5);
      pIVar6 = local_d0;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa35f;
      local_a8 = ::operator-(points + (int)n0,pIVar6);
      pIVar6 = local_d0;
      local_c8->_VtxWritePtr->pos = local_a8;
      local_c8->_VtxWritePtr->uv = IVar2;
      local_c8->_VtxWritePtr->col = col;
      *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x1fa3aa;
      _vtx_count_1 = ::operator+(points + (int)n0,pIVar6);
      local_c8->_VtxWritePtr[1].pos = _vtx_count_1;
      local_c8->_VtxWritePtr[1].uv = IVar2;
      local_c8->_VtxWritePtr[1].col = col & 0xffffff;
      local_c8->_VtxWritePtr = local_c8->_VtxWritePtr + 2;
      *local_c8->_IdxWritePtr = IVar7 + (short)((int)n0 << 1);
      local_c8->_IdxWritePtr[1] = IVar7 + (short)(n0._4_4_ << 1);
      local_c8->_IdxWritePtr[2] = sVar4 + (short)(n0._4_4_ << 1);
      local_c8->_IdxWritePtr[3] = sVar4 + (short)(n0._4_4_ << 1);
      local_c8->_IdxWritePtr[4] = sVar4 + (short)((int)n0 << 1);
      local_c8->_IdxWritePtr[5] = IVar7 + (short)((int)n0 << 1);
      local_c8->_IdxWritePtr = local_c8->_IdxWritePtr + 6;
      n0._4_4_ = (int)n0;
    }
    local_c8->_VtxCurrentIdx = (points_count << 1 & 0xffffU) + local_c8->_VtxCurrentIdx;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2));
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            ImVec2 diff = p1 - p0;
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i0].x = diff.y;
            temp_normals[i0].y = -diff.x;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            ImVec2 dm = (n0 + n1) * 0.5f;
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f)
            {
                float scale = 1.0f / dmr2;
                if (scale > 100.0f) scale = 100.0f;
                dm *= scale;
            }
            dm *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos = (points[i1] - dm); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos = (points[i1] + dm); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}